

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

Vector3d * __thiscall
Util::EGM96Grav::GetGravAccel
          (Vector3d *__return_storage_ptr__,EGM96Grav *this,Vector3d *pos,double JD_UTC)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  Vector3d *pVVar4;
  Vector3d *pVVar5;
  uint uVar6;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *matvecptr;
  long lVar7;
  ActualDstType actualDst;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  uint uVar8;
  PointerType ptr;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar11;
  longdouble in_ST4;
  longdouble lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __y;
  undefined1 auVar19 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> order;
  Vector3d accel;
  Matrix3d R_ecef2eci;
  Matrix3d Rsp2cart;
  undefined1 local_388 [64];
  double local_348;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_2e0;
  double local_2c8;
  ulong uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  double local_2a0;
  Vector3d *local_298;
  Vector3d *local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  vector<int,_std::allocator<int>_> local_268;
  vector<int,_std::allocator<int>_> local_250;
  double local_238;
  double local_228;
  ulong uStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined1 auStack_1f0 [16];
  Vector3d local_1e0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  ulong uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double local_148;
  double dStack_140;
  Matrix3d local_138;
  double dStack_f0;
  double local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  double local_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double adStack_88 [2];
  Matrix3d local_78;
  
  dVar3 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar22 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar2 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  auVar19._0_8_ = dVar2 * dVar2 + dVar22 * dVar22 + dVar3 * dVar3;
  auVar19._8_8_ = 0;
  auVar19 = sqrtpd(auVar19,auVar19);
  dVar22 = auVar19._0_8_;
  local_2a0 = pow(dVar22,3.0);
  dVar2 = this->mu_;
  dVar3 = this->Rearth_;
  local_2e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_2e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2e0.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar7 = 0;
  do {
    *(undefined8 *)
     ((long)((local_2e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_2e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar7 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_2e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_2e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_2e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar7 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_2e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_2e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x40) = 0x3ff0000000000000;
    lVar7 = lVar7 + 0x48;
  } while (lVar7 != 0x120);
  local_2e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2e0.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  matvecptr = &local_2e0;
  local_290 = __return_storage_ptr__;
  ECEF2ECI(&local_138,JD_UTC,this->nut80ptr_,this->iau1980ptr_,matvecptr);
  dVar25 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar23 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_188 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  dStack_180 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1];
  dVar24 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_198 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2];
  uStack_190 = 0;
  local_1a8 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3];
  dStack_1a0 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4];
  local_1c8 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5];
  uStack_1c0 = 0;
  local_1b8 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  dStack_1b0 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
  local_2a8 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  local_298 = pos;
  dVar13 = asin((dVar24 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8] +
                dVar23 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7] +
                dVar25 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6]) / dVar22);
  local_238 = atan2(dVar24 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[5] +
                    dVar23 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[4] +
                    dVar25 * local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[3],
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2] * dVar24 +
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1] * dVar23 +
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0] * dVar25);
  dVar24 = 0.0;
  dVar25 = 0.0;
  local_2c8 = 2.0;
  uStack_2c0 = 0;
  local_348 = 0.0;
  do {
    dVar23 = local_2c8 + 1.0;
    if (0.0 < dVar23) {
      uVar6 = (uint)local_2c8;
      local_178 = -local_2c8;
      uStack_170 = uStack_2c0 ^ 0x8000000000000000;
      __y = 0.0;
      lVar10 = in_ST3;
      local_228 = local_2c8;
      uStack_220 = uStack_2c0;
      do {
        local_2c8 = dVar23;
        local_148 = dVar24;
        dStack_140 = dVar25;
        local_2b8 = pow(dVar3 / dVar22,local_228);
        uVar8 = (uint)__y;
        local_208 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)(int)uVar8 + (long)(int)uVar6];
        uStack_200 = 0;
        local_218 = (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)(int)uVar8 + (long)(int)uVar6];
        uStack_210 = 0;
        uStack_2b0 = extraout_XMM0_Qb;
        dVar25 = pow(-1.0,__y);
        local_270 = sin(dVar13);
        lVar9 = (longdouble)local_270;
        lVar11 = in_ST4;
        lVar12 = in_ST4;
        in_ST3 = in_ST4;
        powl();
        boost::math::detail::
        legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)(ulong)uVar6,(detail *)(ulong)uVar8,(int)&local_e8,(int)matvecptr,
                   lVar9,in_ST0,in_R8);
        in_ST0 = in_ST4;
        if ((longdouble)1.79769313486232e+308 < ABS(in_ST1)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
        }
        dVar24 = (double)in_ST1;
        local_278 = dVar24;
        dVar23 = pow(-1.0,__y);
        local_280 = sin(dVar13);
        lVar9 = (longdouble)local_280;
        in_ST1 = lVar11;
        in_ST4 = in_ST3;
        powl();
        boost::math::detail::
        legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)(ulong)(uVar6 - 1),(detail *)(ulong)uVar8,(int)&local_e8,
                   (int)matvecptr,lVar9,in_ST2,in_R8);
        in_ST2 = lVar12;
        if ((longdouble)1.79769313486232e+308 < ABS(lVar10)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
        }
        local_288 = (double)lVar10;
        dVar25 = dVar25 * dVar24;
        dVar23 = dVar23 * local_288;
        dVar21 = local_2c8 * local_2b8;
        dVar24 = local_238 * __y;
        dVar14 = cos(dVar24);
        dVar15 = sin(dVar24);
        local_348 = local_348 + (dVar14 * local_208 + dVar15 * local_218) * dVar21 * dVar25;
        dVar14 = sin(dVar13);
        dVar14 = dVar14 * local_178;
        dVar15 = cos(dVar13);
        dVar21 = local_228 + __y;
        dVar16 = cos(dVar13);
        dVar17 = cos(dVar24);
        dVar18 = sin(dVar24);
        local_168 = local_2b8 * __y;
        uStack_160 = uStack_2b0;
        local_158 = cos(dVar24);
        dVar24 = sin(dVar24);
        dVar24 = local_148 + (local_158 * local_218 + -local_208 * dVar24) * dVar25 * local_168;
        dVar25 = dStack_140 +
                 (dVar17 * local_208 + dVar18 * local_218) *
                 ((1.0 / dVar15) * dVar14 * dVar25 + (1.0 / dVar16) * dVar21 * dVar23) * local_2b8;
        __y = __y + 1.0;
        lVar10 = in_ST3;
        dVar23 = local_2c8;
      } while (__y < local_2c8);
    }
    local_2c8 = dVar23;
  } while (local_2c8 < 21.0);
  dVar22 = dVar22 * dVar22;
  local_388._8_8_ = dVar25 * dVar2;
  local_388._0_8_ = (dVar2 * dVar24) / dVar22;
  auVar20._0_8_ = cos(dVar13);
  local_1f8 = (-dVar2 / dVar22) * local_348;
  auVar20._8_8_ = dVar22;
  auVar19 = divpd(local_388._0_16_,auVar20);
  local_e8 = 6.36598737388395e-314;
  uStack_e0 = 1;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_e8;
  auStack_1f0 = auVar19;
  std::vector<int,_std::allocator<int>_>::vector(&local_250,__l,(allocator_type *)&local_78);
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -local_238;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar13;
  std::vector<int,_std::allocator<int>_>::vector(&local_268,&local_250);
  pVVar5 = local_290;
  pVVar4 = local_298;
  Angle2RotM(&local_78,&local_1e0,&local_268);
  if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  dVar24 = -dVar2 / local_2a0;
  dVar3 = (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar22 = (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar2 = (pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  lVar7 = 0x10;
  do {
    dVar25 = *(double *)
              ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array + lVar7);
    dVar23 = *(double *)((long)adStack_88 + lVar7);
    dVar13 = *(double *)((long)adStack_88 + lVar7 + 8);
    *(double *)
     ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar7 + 0x40) = dVar13 * local_1a8 + dVar23 * local_188 + dVar25 * local_1b8;
    *(double *)((long)&dStack_f0 + lVar7) =
         dVar13 * dStack_1a0 + dVar23 * dStack_180 + dVar25 * dStack_1b0;
    *(double *)((long)&local_e8 + lVar7) =
         local_1c8 * dVar13 + dVar25 * local_2a8 + local_198 * dVar23;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x58);
  local_388._8_8_ = auVar19._8_8_;
  (pVVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       dVar3 * dVar24 +
       (double)auStack_1f0._8_8_ * local_b8 +
       (double)auStack_1f0._0_8_ * local_d0 + local_1f8 * local_e8;
  (pVVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
       dVar22 * dVar24 +
       (double)auStack_1f0._8_8_ * dStack_b0 +
       (double)auStack_1f0._0_8_ * dStack_c8 + local_1f8 * (double)CONCAT44(uStack_dc,uStack_e0);
  (pVVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       dVar24 * dVar2 +
       (double)local_388._8_8_ * local_a8 + (double)auStack_1f0._0_8_ * local_c0 +
       local_1f8 * local_d8;
  if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar5;
}

Assistant:

Eigen::Vector3d EGM96Grav::GetGravAccel(Eigen::Vector3d pos, double JD_UTC){

		//make short namespace
		namespace bm = boost::math;

		//initialize output
		Eigen::Vector3d accel;

		//locals
		double r = pos.norm();
		double r2 = pow(r,2.0);
		double r3 = pow(r,3.0);
		double R = this->Rearth_;
		double mu = this->mu_;
		double pUpr = 0.0; //partial potential wrt radius
		double pUpphi = 0.0; //partial potential wrt satellite latitude
		double pUplamb = 0.0; //partial potential wrt satellite latitude
		double nr_ij = sqrt(pow(pos[0],2.0) + pow(pos[1],2.0));

		//matrix rotating from ECEF2ECI
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = ECEF2ECI(JD_UTC, this->nut80ptr_, this->iau1980ptr_, &matvec);

		//ecef position
		Eigen::Vector3d pos_ecef = R_ecef2eci.transpose()*pos;

		// std::cout << "pos_ecef: \n" << pos_ecef << "\n";

		//lat and long
		double phi = asin(pos_ecef[2]/r);
		double lamb = atan2(pos_ecef[1],pos_ecef[0]);

		// std::cout << " JD_UTC: " << JD_UTC << " r: " << r << " phi: " << phi << " lamb: " << lamb << "\n";

		//fixed order gravity model but have capability to do more
		for (double ll = 2; ll < 21; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

		// for (double ll = 2; ll < 3; ++ll) {

		// 	for (double mm = 0; mm < 1; ++mm) {

				//locals
				double powR = pow(R/r,ll);
				double C = this->C_( (int) ll, (int) mm);
				double S = this->S_( (int) ll, (int) mm);
				double Plm = pow(-1.0,mm)*bm::legendre_p( (int) ll, (int) mm, sin(phi)); //pow(-1,m) to account for cordon shortley
				// double Plm_plus = pow(-1.0,mm+1.0)*bm::legendre_p( (int) ll, ((int) mm) + 1, sin(phi));
				double Plm_plus = pow(-1.0,mm)*bm::legendre_p( (int) ll - 1, (int) mm, sin(phi));

				// std::cout << "l: " << ll << " m: " << mm << "\n";

				pUpr += powR*(ll + 1.0)*Plm*(C*cos(mm*lamb) + S*sin(mm*lamb));
				// pUpphi += powR*(Plm_plus - mm*tan(phi)*Plm) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUpphi += powR*(-ll*sin(phi)*(1/cos(phi))*Plm + (ll+mm)*(1/cos(phi))*Plm_plus) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUplamb += powR*mm*Plm*(S*cos(mm*lamb) - C*sin(mm*lamb));

			}

		}

		//additional factors outside of sum for partials
		// pUpr = pUpr*(-mu/pow(r,2.0));
		// pUpphi = pUpphi*mu/r;
		// pUplamb = pUplamb*mu/r;
		pUpr = pUpr*(-mu/pow(r,2.0));
		pUpphi = pUpphi*mu/pow(r,2.0);
		pUplamb = pUplamb*mu/pow(r,2.0)/cos(phi);

		// pUpphi = -7.0036240305764034*pow(10.0,-8.0);

		// std::cout << "pUpr: " << pUpr << "\n" << "pUpphi: " << pUpphi << "\n" << "pUplamb: " << pUplamb << "\n";

		//calculate components of acceleration
		// accel[0] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[0] - pUplamb*pos[1]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[0]/r3;
		// accel[1] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[1] + pUplamb*pos[0]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[1]/r3;
		// accel[2] = pUpr*pos[2]/r + nr_ij*pUpphi/r2 - mu*pos[2]/r3;
		accel[0] = pUpr;
		accel[1] = pUplamb;
		accel[2] = pUpphi;

		//rotation from spherical to cartesian
		Eigen::Vector3d angles = {phi, -lamb, 0.0};
		std::vector<int> order = {2,3,1};
		Eigen::Matrix3d Rsp2cart = Angle2RotM(angles, order);

		//we also need the central acceleration in ECI
		Eigen::Vector3d accel_central = -(mu/r3)*pos;

		//rotate accel into ECI
		Eigen::Vector3d accel_eci = R_ecef2eci*Rsp2cart*accel + accel_central;

		// std::cout << "\n" << "accel ecef (no central): \n" << Rsp2cart*accel;
		// std::cout << "\n" << "accel eci (with central): \n" << accel_eci;

		// exit(0);

		return accel_eci;

	}